

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

int __thiscall
cmCTestCoverageHandler::HandleTracePyCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  ulong uVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  pointer piVar4;
  iterator __position;
  char cVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar9;
  ostream *poVar10;
  mapped_type *this_00;
  pointer pbVar11;
  undefined8 fileName_00;
  ulong uVar12;
  cmCTestCoverageHandler *this_01;
  _Base_ptr p_Var13;
  string nl;
  string prefix;
  string tempDir;
  string daGlob;
  string testingDir;
  string actualSourceFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string fileName;
  ostringstream cmCTestLog_msg_4;
  ostringstream cmCTestLog_msg;
  Glob gl;
  undefined1 local_548 [56];
  _Base_ptr local_510 [2];
  _Base_ptr local_500;
  size_t local_4f8;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  _Alloc_hider local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  string local_448;
  cmCTestCoverageHandlerContainer *local_428;
  _Base_ptr local_420;
  _Base_ptr local_418;
  _Base_ptr local_410;
  undefined1 local_408 [16];
  _Base_ptr local_3f8 [12];
  ios_base local_398 [264];
  undefined1 local_290 [32];
  byte abStack_270 [80];
  ios_base local_220 [408];
  Glob local_88;
  
  cmsys::Glob::Glob(&local_88);
  local_88.Recurse = true;
  local_88.RecurseThroughSymlinks = false;
  local_4c0._0_8_ = local_4c0 + 0x10;
  pcVar2 = (cont->BinaryDir)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4d0 + 0x10),pcVar2,pcVar2 + (cont->BinaryDir)._M_string_length);
  std::__cxx11::string::append(local_4d0 + 0x10);
  cmsys::Glob::FindFiles(&local_88,(string *)(local_4d0 + 0x10),(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_460,__x);
  if (local_460._M_allocated_capacity == local_460._8_8_) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_290," Cannot find any Python Trace.py coverage files.",0x30);
    std::ios::widen((char)(ostream *)local_290 + (char)*(undefined8 *)(local_290._0_8_ + -0x18));
    std::ostream::put((char)local_290);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x680,(char *)CONCAT44(local_408._4_4_,local_408._0_4_),
                 (this->super_cmCTestGenericHandler).Quiet);
    if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
      operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                      (ulong)((long)&local_3f8[0]->_M_color + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
    std::ios_base::~ios_base(local_220);
    iVar8 = 0;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_((string *)local_290,(this->super_cmCTestGenericHandler).CTest);
    plVar9 = (long *)std::__cxx11::string::append(local_290);
    local_4b0._16_8_ = (long)local_4b0 + 0x20;
    pbVar11 = (pointer)(plVar9 + 2);
    if ((pointer)*plVar9 == pbVar11) {
      local_490._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      local_490._M_string_length = plVar9[3];
    }
    else {
      local_490._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      local_4b0._16_8_ = (pointer)*plVar9;
    }
    local_4b0._24_8_ = plVar9[1];
    *plVar9 = (long)pbVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    local_4e0._0_8_ = local_4e0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_4f0 + 0x10),local_4b0._16_8_,
               (long)((RegularExpressionMatch *)local_4b0._24_8_)->startp + local_4b0._16_8_);
    std::__cxx11::string::append(local_4f0 + 0x10);
    p_Var13 = (_Base_ptr)0x0;
    this_01 = (cmCTestCoverageHandler *)0x0;
    cmsys::SystemTools::MakeDirectory((string *)(local_4f0 + 0x10),(mode_t *)0x0);
    local_410 = (_Base_ptr)local_460._8_8_;
    if (local_460._M_allocated_capacity != local_460._8_8_) {
      local_418 = (_Base_ptr)&cont->TotalCoverage;
      p_Var13 = (_Base_ptr)0x0;
      fileName_00 = local_460._M_allocated_capacity;
      local_548._32_8_ = this;
      local_428 = cont;
      do {
        FindFile(&local_448,this_01,cont,(string *)fileName_00);
        if (local_448._M_string_length == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"Cannot find source Python file corresponding to: ",0x31);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,*(char **)fileName_00,
                               (long)((_Base_ptr)fileName_00)->_M_parent);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x68f,(char *)CONCAT44(local_408._4_4_,local_408._0_4_),false);
          if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
            operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                            (ulong)((long)&local_3f8[0]->_M_color + 1));
          }
          this_01 = (cmCTestCoverageHandler *)&std::__cxx11::ostringstream::VTT;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
        }
        else {
          cmsys::SystemTools::CollapseFullPath((string *)&local_490.field_2,&local_448);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"   Check coverage for file: ",0x1c);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,(char *)local_490.field_2._M_allocated_capacity,
                               local_490.field_2._8_8_);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x697,(char *)CONCAT44(local_408._4_4_,local_408._0_4_),
                       (this->super_cmCTestGenericHandler).Quiet);
          if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
            operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                            (ulong)((long)&local_3f8[0]->_M_color + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_418,(key_type *)&local_490.field_2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"   in file: ",0xc);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,*(char **)fileName_00,
                               (long)((_Base_ptr)fileName_00)->_M_parent);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x69b,(char *)CONCAT44(local_408._4_4_,local_408._0_4_),
                       (this->super_cmCTestGenericHandler).Quiet);
          if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
            operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                            (ulong)((long)&local_3f8[0]->_M_color + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
          std::ifstream::ifstream((ostringstream *)local_290,*(char **)fileName_00,_S_in);
          if ((abStack_270[*(long *)(local_290._0_8_ + -0x18)] & 5) == 0) {
            local_548._0_8_ = local_548 + 0x10;
            local_548._8_8_ = 0;
            local_548[0x10] = 0;
            uVar1 = 0xffffffffffffffff;
            local_420 = p_Var13;
            while( true ) {
              uVar12 = uVar1;
              this_01 = (cmCTestCoverageHandler *)local_548;
              bVar7 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)local_290,(string *)this_01,(bool *)0x0,-1);
              if (!bVar7) break;
              uVar1 = uVar12 + 1;
              if (0xb < (ulong)local_548._8_8_) {
                std::__cxx11::string::substr((ulong)&local_500,(ulong)local_548);
                if ((local_500->field_0x5 != ' ') && (local_500->field_0x5 != ':')) {
                  std::__cxx11::string::substr((ulong)local_408,(ulong)local_548);
                  std::__cxx11::string::operator=((string *)&local_500,(string *)local_408);
                  if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
                    operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                                    (ulong)((long)&local_3f8[0]->_M_color + 1));
                  }
                  if ((local_500->field_0x6 != ' ') && (local_500->field_0x6 != ':')) {
                    std::__cxx11::string::substr((ulong)local_408,(ulong)local_548);
                    std::__cxx11::string::operator=((string *)&local_500,(string *)local_408);
                    if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
                      operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                                      (ulong)((long)&local_3f8[0]->_M_color + 1));
                    }
                    if ((local_500->field_0x7 != ' ') && (local_500->field_0x7 != ':')) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_408,
                                 "Currently the limit is maximum coverage of 999999",0x31);
                      cVar5 = (char)(ostringstream *)local_408;
                      std::ios::widen((char)*(undefined8 *)
                                             (CONCAT44(local_408._4_4_,local_408._0_4_) + -0x18) +
                                      cVar5);
                      std::ostream::put(cVar5);
                      std::ostream::flush();
                      pcVar3 = ((cmCTestGenericHandler *)local_548._32_8_)->CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar3,7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x6bb,(char *)local_548._40_8_,false);
                      if ((_Base_ptr *)local_548._40_8_ != local_510) {
                        operator_delete((void *)local_548._40_8_,
                                        (ulong)((long)&local_510[0]->_M_color + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
                      std::ios_base::~ios_base(local_398);
                    }
                  }
                }
                p_Var13 = local_500;
                iVar8 = atoi((char *)local_500);
                if (*(char *)((long)p_Var13 + (local_4f8 - 1)) != ':') {
                  iVar8 = 0;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_408,"Prefix: ",8);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_408,(char *)local_500,local_4f8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," cov: ",6);
                plVar9 = (long *)std::ostream::operator<<(poVar10,iVar8);
                std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
                std::ostream::put((char)plVar9);
                std::ostream::flush();
                uVar6 = local_548._32_8_;
                pcVar3 = ((cmCTestGenericHandler *)local_548._32_8_)->CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,0,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x6c8,(char *)local_548._40_8_,((cmCTestGenericHandler *)uVar6)->Quiet
                            );
                if ((_Base_ptr *)local_548._40_8_ != local_510) {
                  operator_delete((void *)local_548._40_8_,
                                  (ulong)((long)&local_510[0]->_M_color + 1));
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
                std::ios_base::~ios_base(local_398);
                while( true ) {
                  piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  __position._M_current =
                       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (uVar1 < (ulong)((long)__position._M_current - (long)piVar4 >> 2)) break;
                  local_408._0_4_ = 0xffffffff;
                  if (__position._M_current ==
                      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (this_00,__position,(int *)local_408);
                  }
                  else {
                    *__position._M_current = -1;
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current + 1;
                  }
                }
                if ((piVar4[uVar12 + 1] < 0) && (-1 < iVar8)) {
                  piVar4[uVar12 + 1] = 0;
                }
                piVar4[uVar12 + 1] = piVar4[uVar12 + 1] + iVar8;
                if (local_500 != (_Base_ptr)local_4f0) {
                  operator_delete(local_500,local_4f0._0_8_ + 1);
                }
              }
            }
            this = (cmCTestCoverageHandler *)local_548._32_8_;
            p_Var13 = local_420;
            cont = local_428;
            if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
              this_01 = (cmCTestCoverageHandler *)(CONCAT71(local_548._17_7_,local_548[0x10]) + 1);
              operator_delete((void *)local_548._0_8_,(ulong)this_01);
              this = (cmCTestCoverageHandler *)local_548._32_8_;
              p_Var13 = local_420;
              cont = local_428;
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_408,"Cannot open file: ",0x12);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_408,*(char **)fileName_00,
                                 (long)((_Base_ptr)fileName_00)->_M_parent);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x69f,(char *)local_548._0_8_,false);
            if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
              operator_delete((void *)local_548._0_8_,CONCAT71(local_548._17_7_,local_548[0x10]) + 1
                             );
            }
            this_01 = (cmCTestCoverageHandler *)&std::__cxx11::ostringstream::VTT;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
            std::ios_base::~ios_base(local_398);
          }
          std::ifstream::~ifstream(local_290);
          if ((_Alloc_hider *)local_490.field_2._M_allocated_capacity != &local_470) {
            this_01 = (cmCTestCoverageHandler *)(local_470._M_p + 1);
            operator_delete((void *)local_490.field_2._M_allocated_capacity,(ulong)this_01);
          }
          p_Var13 = (_Base_ptr)(ulong)((int)p_Var13 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          this_01 = (cmCTestCoverageHandler *)(local_448.field_2._M_allocated_capacity + 1);
          operator_delete(local_448._M_dataplus._M_p,(ulong)this_01);
        }
        fileName_00 = fileName_00 + 0x20;
      } while ((_Base_ptr)fileName_00 != local_410);
    }
    iVar8 = (int)p_Var13;
    if ((_Base_ptr)local_4e0._0_8_ != (_Base_ptr)(local_4e0 + 0x10)) {
      operator_delete((void *)local_4e0._0_8_,(ulong)((long)(_Rb_tree_color *)local_4d0._0_8_ + 1));
    }
    if ((pointer)local_4b0._16_8_ != (pointer)((long)local_4b0 + 0x20U)) {
      operator_delete((void *)local_4b0._16_8_,(ulong)(local_490._M_dataplus._M_p + 1));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_460);
  if ((cmCTestCommand *)local_4c0._0_8_ != (cmCTestCommand *)(local_4c0 + 0x10)) {
    operator_delete((void *)local_4c0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_4b0._0_8_)->_M_p + 1));
  }
  cmsys::Glob::~Glob(&local_88);
  return iVar8;
}

Assistant:

int cmCTestCoverageHandler::HandleTracePyCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();
  std::string daGlob = cont->BinaryDir + "/*.cover";
  gl.FindFiles(daGlob);
  std::vector<std::string> files = gl.GetFiles();

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any Python Trace.py coverage files."
                         << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }

  std::string testingDir = this->CTest->GetBinaryDir() + "/Testing";
  std::string tempDir = testingDir + "/CoverageInfo";
  cmSystemTools::MakeDirectory(tempDir);

  int file_count = 0;
  for (std::string const& file : files) {
    std::string fileName = this->FindFile(cont, file);
    if (fileName.empty()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot find source Python file corresponding to: "
                   << file << std::endl);
      continue;
    }

    std::string actualSourceFile = cmSystemTools::CollapseFullPath(fileName);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   Check coverage for file: " << actualSourceFile
                                                      << std::endl,
                       this->Quiet);
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector* vec =
      &cont->TotalCoverage[actualSourceFile];
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   in file: " << file << std::endl, this->Quiet);
    cmsys::ifstream ifile(file.c_str());
    if (!ifile) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open file: " << file << std::endl);
    } else {
      long cnt = -1;
      std::string nl;
      while (cmSystemTools::GetLineFromStream(ifile, nl)) {
        cnt++;

        // Skip empty lines
        if (nl.empty()) {
          continue;
        }

        // Skip unused lines
        if (nl.size() < 12) {
          continue;
        }

        // Read the coverage count from the beginning of the Trace.py output
        // line
        std::string prefix = nl.substr(0, 6);
        if (prefix[5] != ' ' && prefix[5] != ':') {
          // This is a hack. We should really do something more elaborate
          prefix = nl.substr(0, 7);
          if (prefix[6] != ' ' && prefix[6] != ':') {
            prefix = nl.substr(0, 8);
            if (prefix[7] != ' ' && prefix[7] != ':') {
              cmCTestLog(this->CTest, ERROR_MESSAGE,
                         "Currently the limit is maximum coverage of 999999"
                           << std::endl);
            }
          }
        }
        int cov = atoi(prefix.c_str());
        if (prefix[prefix.size() - 1] != ':') {
          // This line does not have ':' so no coverage here. That said,
          // Trace.py does not handle not covered lines versus comments etc.
          // So, this will be set to 0.
          cov = 0;
        }
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "Prefix: " << prefix << " cov: " << cov << std::endl, this->Quiet);
        // Read the line number starting at the 10th character of the gcov
        // output line
        long lineIdx = cnt;
        if (lineIdx >= 0) {
          while (vec->size() <= static_cast<size_t>(lineIdx)) {
            vec->push_back(-1);
          }
          // Initially all entries are -1 (not used). If we get coverage
          // information, increment it to 0 first.
          if ((*vec)[lineIdx] < 0) {
            if (cov >= 0) {
              (*vec)[lineIdx] = 0;
            }
          }
          (*vec)[lineIdx] += cov;
        }
      }
    }
    ++file_count;
  }
  return file_count;
}